

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O1

int BN_exp(BIGNUM *r,BIGNUM *a,BIGNUM *p,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *a_00;
  BIGNUM *pBVar5;
  
  BN_CTX_start(ctx);
  pBVar4 = r;
  if (r == a || r == p) {
    pBVar4 = BN_CTX_get(ctx);
  }
  a_00 = BN_CTX_get(ctx);
  if ((a_00 != (BIGNUM *)0x0 && pBVar4 != (BIGNUM *)0x0) &&
     (pBVar5 = BN_copy(a_00,a), pBVar5 != (BIGNUM *)0x0)) {
    iVar1 = BN_num_bits(p);
    iVar2 = BN_is_odd((BIGNUM *)p);
    if (iVar2 == 0) {
      iVar2 = BN_one((BIGNUM *)pBVar4);
      if (iVar2 != 0) goto LAB_002421fb;
    }
    else {
      pBVar5 = BN_copy(pBVar4,a);
      if (pBVar5 != (BIGNUM *)0x0) {
LAB_002421fb:
        if (1 < iVar1) {
          iVar2 = 1;
          do {
            iVar3 = BN_sqr(a_00,a_00,ctx);
            if ((iVar3 == 0) ||
               ((iVar3 = BN_is_bit_set(p,iVar2), iVar3 != 0 &&
                (iVar3 = BN_mul(pBVar4,pBVar4,a_00,ctx), iVar3 == 0)))) goto LAB_00242265;
            iVar2 = iVar2 + 1;
          } while (iVar1 != iVar2);
        }
        iVar1 = 0;
        if ((pBVar4 == r) || (pBVar4 = BN_copy(r,pBVar4), pBVar4 != (BIGNUM *)0x0)) {
          iVar1 = 1;
        }
        goto LAB_00242267;
      }
    }
  }
LAB_00242265:
  iVar1 = 0;
LAB_00242267:
  BN_CTX_end(ctx);
  return iVar1;
}

Assistant:

int BN_exp(BIGNUM *r, const BIGNUM *a, const BIGNUM *p, BN_CTX *ctx) {
  bssl::BN_CTXScope scope(ctx);
  BIGNUM *rr;
  if (r == a || r == p) {
    rr = BN_CTX_get(ctx);
  } else {
    rr = r;
  }

  BIGNUM *v = BN_CTX_get(ctx);
  if (rr == NULL || v == NULL) {
    return 0;
  }

  if (BN_copy(v, a) == NULL) {
    return 0;
  }
  int bits = BN_num_bits(p);

  if (BN_is_odd(p)) {
    if (BN_copy(rr, a) == NULL) {
      return 0;
    }
  } else {
    if (!BN_one(rr)) {
      return 0;
    }
  }

  for (int i = 1; i < bits; i++) {
    if (!BN_sqr(v, v, ctx)) {
      return 0;
    }
    if (BN_is_bit_set(p, i)) {
      if (!BN_mul(rr, rr, v, ctx)) {
        return 0;
      }
    }
  }

  if (r != rr && !BN_copy(r, rr)) {
    return 0;
  }
  return 1;
}